

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::ClassId(TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_69;
  string local_68;
  TPZGeoPyramid local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"TPZGeoElRefLess",&local_69);
  uVar1 = Hash(&local_68);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoPyramid::TPZGeoPyramid(&local_48);
  iVar3 = pzgeom::TPZGeoPyramid::ClassId(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}